

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFour.cpp
# Opt level: O2

string * __thiscall
BlueRoomFour::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,BlueRoomFour *this,bool longform)

{
  itemLocation iVar1;
  ItemWrapper *this_00;
  ulong uVar2;
  itemType local_1c;
  
  local_1c = ROPE;
  this_00 = ItemTable::getValue((this->super_Room).table,&local_1c);
  iVar1 = ItemWrapper::getLocation(this_00);
  uVar2 = 0x48;
  if (iVar1 != HIDDEN) {
    uVar2 = (ulong)!longform << 5 | 8;
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)((long)&(this->super_Room)._vptr_Room + uVar2));
  return __return_storage_ptr__;
}

Assistant:

std::string BlueRoomFour::getDescription(bool longform) {
    if(table->getValue(ROPE)->getLocation() == HIDDEN) {
        return rstate2;
    }
    if(longform){
        return rstate0;
    } else
        return rstate1;
}